

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

bool __thiscall
re2::TestInstance::RunCase(TestInstance *this,StringPiece *text,StringPiece *context,Anchor anchor)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  _Alloc_hider _Var4;
  uint32 uVar5;
  ostream *poVar6;
  StringPiece *pSVar7;
  long lVar8;
  ParseFlags flags;
  StringPiece *src;
  bool bVar9;
  char *pcVar10;
  ulong uVar11;
  string *__return_storage_ptr__;
  ulong uVar12;
  ulong uVar13;
  Engine type;
  StringPiece *text_00;
  StringPiece *text_01;
  string local_440;
  string local_420;
  string local_400;
  LogMessage local_3e0;
  Result r;
  Result correct;
  
  Result::Result(&correct);
  RunSearch(this,kEngineBacktrack,text,context,anchor,&correct);
  if (correct.skipped == false) {
    bVar9 = true;
    for (type = kEngineNFA; type != kEngineMax; type = type + kEngineNFA) {
      uVar5 = Engines();
      if ((uVar5 >> (type & 0x1f) & 1) != 0) {
        Result::Result(&r);
        RunSearch(this,type,text,context,anchor,&r);
        if (r.skipped == false) {
          if (r.matched != correct.matched) {
LAB_0012463a:
            if (type == kEnginePCRE) {
              uVar3 = text->length_;
              uVar13 = 0;
              if (0 < (int)uVar3) {
                uVar13 = (ulong)uVar3;
              }
              uVar11 = 0xffffffffffffffff;
              do {
                uVar12 = uVar13;
                if (uVar11 - uVar13 == -1) break;
                uVar12 = uVar11 + 1;
                lVar8 = uVar11 + 1;
                uVar11 = uVar12;
              } while (-1 < text->ptr_[lVar8]);
              if ((long)uVar12 < (long)(int)uVar3) goto LAB_001248c1;
            }
            bVar9 = (bool)(bVar9 & r.untrusted);
            pcVar10 = "Mismatch: ";
            if (r.untrusted != false) {
              pcVar10 = "(Untrusted) Mismatch: ";
            }
            LogMatch(this,pcVar10,type,text,context,anchor);
            if (r.matched != correct.matched) {
              if (r.matched == false) {
                LogMessage::LogMessage
                          (&local_3e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                           ,0x21a,0);
                std::operator<<((ostream *)&local_3e0.str_,"   Should match (but does not).");
                LogMessage::~LogMessage(&local_3e0);
                goto LAB_001248c1;
              }
              LogMessage::LogMessage
                        (&local_3e0,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                         ,0x218,0);
              std::operator<<((ostream *)&local_3e0.str_,"   Should not match (but does).");
              LogMessage::~LogMessage(&local_3e0);
            }
            text_01 = r.submatch;
            text_00 = correct.submatch;
            for (lVar8 = 0; __return_storage_ptr__ = &local_440, lVar8 <= this->num_captures_;
                lVar8 = lVar8 + 1) {
              if ((text_01->ptr_ == text_00->ptr_) &&
                 (text_01->ptr_ + text_01->length_ == text_00->ptr_ + text_00->length_)) {
                pSVar7 = (StringPiece *)0x0;
                LogMessage::LogMessage
                          (&local_3e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                           ,0x227,0);
                FormatCapture_abi_cxx11_(&local_420,(re2 *)text,text_01,pSVar7);
                StringPrintf_abi_cxx11_
                          (__return_storage_ptr__,"   $%d: %s ok",lVar8,local_420._M_dataplus._M_p);
                std::operator<<((ostream *)&local_3e0.str_,(string *)__return_storage_ptr__);
              }
              else {
                pSVar7 = (StringPiece *)0x0;
                LogMessage::LogMessage
                          (&local_3e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                           ,0x221,0);
                FormatCapture_abi_cxx11_(&local_420,(re2 *)text,text_00,pSVar7);
                _Var4._M_p = local_420._M_dataplus._M_p;
                FormatCapture_abi_cxx11_(&local_400,(re2 *)text,text_01,pSVar7);
                StringPrintf_abi_cxx11_
                          (&local_440,"   $%d: should be %s is %s",lVar8,_Var4._M_p,
                           local_400._M_dataplus._M_p);
                std::operator<<((ostream *)&local_3e0.str_,(string *)&local_440);
                std::__cxx11::string::~string((string *)&local_440);
                __return_storage_ptr__ = &local_400;
              }
              std::__cxx11::string::~string((string *)__return_storage_ptr__);
              std::__cxx11::string::~string((string *)&local_420);
              LogMessage::~LogMessage(&local_3e0);
              text_00 = text_00 + 1;
              text_01 = text_01 + 1;
            }
            goto LAB_001248c1;
          }
          if ((r.have_submatch != false) || (r.have_submatch0 == true)) {
            lVar8 = 0x10;
            do {
              if (lVar8 + 0x10 == 0x130) goto LAB_00124593;
              if (*(long *)((long)(correct.submatch + -1) + lVar8) !=
                  *(long *)((long)(r.submatch + -1) + lVar8)) goto LAB_0012463a;
              iVar1 = *(int *)((long)correct.submatch + lVar8 + -8);
              iVar2 = *(int *)((long)r.submatch + lVar8 + -8);
            } while ((iVar1 == iVar2) && (lVar8 = lVar8 + 0x10, r.have_submatch != false));
            if (iVar1 != iVar2) goto LAB_0012463a;
          }
        }
LAB_00124593:
        if (FLAGS_log_okay == '\x01') {
          pcVar10 = "Okay: ";
          if (r.skipped != false) {
            pcVar10 = "Skipped: ";
          }
          LogMatch(this,pcVar10,type,text,context,anchor);
        }
      }
LAB_001248c1:
    }
    if (FLAGS_max_regexp_failures < 1 || bVar9 != false) {
      return bVar9;
    }
    FLAGS_max_regexp_failures = FLAGS_max_regexp_failures + -1;
    if (FLAGS_max_regexp_failures == 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_3e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                 ,0x230);
      std::operator<<((ostream *)&local_3e0.str_,"Too many regexp failures.");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3e0);
    }
  }
  else {
    if (this->regexp_ == (Regexp *)0x0) {
      return true;
    }
    LogMessage::LogMessage
              (&local_3e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x1f0,2);
    poVar6 = std::operator<<((ostream *)&local_3e0.str_,"Skipped backtracking! ");
    CEscape_abi_cxx11_((string *)&r,(re2 *)this->regexp_str_,src);
    poVar6 = std::operator<<(poVar6,(string *)&r);
    poVar6 = std::operator<<(poVar6," ");
    FormatMode_abi_cxx11_(&local_440,(re2 *)(ulong)this->flags_,flags);
    std::operator<<(poVar6,(string *)&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&r);
    LogMessage::~LogMessage(&local_3e0);
  }
  return false;
}

Assistant:

bool TestInstance::RunCase(const StringPiece& text, const StringPiece& context,
                           Prog::Anchor anchor) {
  // Backtracking is the gold standard.
  Result correct;
  RunSearch(kEngineBacktrack, text, context, anchor, &correct);
  if (correct.skipped) {
    if (regexp_ == NULL)
      return true;
    LOG(ERROR) << "Skipped backtracking! " << CEscape(regexp_str_)
               << " " << FormatMode(flags_);
    return false;
  }
  VLOG(1) << "Try: regexp " << CEscape(regexp_str_)
          << " text " << CEscape(text)
          << " (" << FormatKind(kind_)
          << ", " << FormatAnchor(anchor)
          << ", " << FormatMode(flags_)
          << ")";

  // Compare the others.
  bool all_okay = true;
  for (Engine i = kEngineBacktrack+1; i < kEngineMax; i++) {
    if (!(Engines() & (1<<i)))
      continue;

    Result r;
    RunSearch(i, text, context, anchor, &r);
    if (ResultOkay(r, correct)) {
      if (FLAGS_log_okay)
        LogMatch(r.skipped ? "Skipped: " : "Okay: ", i, text, context, anchor);
      continue;
    }

    // We disagree with PCRE on the meaning of some Unicode matches.
    // In particular, we treat non-ASCII UTF-8 as non-word characters.
    // We also treat "empty" character sets like [^\w\W] as being
    // impossible to match, while PCRE apparently excludes some code
    // points (e.g., 0x0080) from both \w and \W.
    if (i == kEnginePCRE && NonASCII(text))
      continue;

    if (!r.untrusted)
      all_okay = false;

    LogMatch(r.untrusted ? "(Untrusted) Mismatch: " : "Mismatch: ", i, text,
             context, anchor);
    if (r.matched != correct.matched) {
      if (r.matched) {
        LOG(INFO) << "   Should not match (but does).";
      } else {
        LOG(INFO) << "   Should match (but does not).";
        continue;
      }
    }
    for (int i = 0; i < 1+num_captures_; i++) {
      if (r.submatch[i].begin() != correct.submatch[i].begin() ||
          r.submatch[i].end() != correct.submatch[i].end()) {
        LOG(INFO) <<
          StringPrintf("   $%d: should be %s is %s",
                       i,
                       FormatCapture(text, correct.submatch[i]).c_str(),
                       FormatCapture(text, r.submatch[i]).c_str());
      } else {
        LOG(INFO) <<
          StringPrintf("   $%d: %s ok", i,
                       FormatCapture(text, r.submatch[i]).c_str());
      }
    }
  }

  if (!all_okay) {
    if (FLAGS_max_regexp_failures > 0 && --FLAGS_max_regexp_failures == 0)
      LOG(QFATAL) << "Too many regexp failures.";
  }

  return all_okay;
}